

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo2.cpp
# Opt level: O1

int64_t primesum::pi_lmo2(int64_t x)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  int *piVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int64_t iVar9;
  int128_t *piVar10;
  long r;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int128_t *piVar16;
  int *piVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  double dVar21;
  vector<int,_std::allocator<int>_> primes;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> lpf;
  vector<char,_std::allocator<char>_> sieve;
  int256_t s1;
  int256_t p2;
  undefined7 in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff0f;
  undefined8 in_stack_ffffffffffffff10;
  vector<int,_std::allocator<int>_> local_e8;
  ulong local_d0;
  int128_t *local_c8;
  vector<int,_std::allocator<int>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<char,_std::allocator<char>_> local_90;
  int256_t local_78;
  int256_t local_58;
  
  if (x < 2) {
    iVar9 = 0;
  }
  else {
    x_00[7] = in_stack_ffffffffffffff0f;
    x_00._0_7_ = in_stack_ffffffffffffff08;
    x_00._8_8_ = in_stack_ffffffffffffff10;
    dVar20 = get_alpha_lmo((primesum *)x,(int128_t)x_00);
    dVar21 = pow((double)x,0.3333333333333333);
    lVar7 = (long)dVar21;
    if (0 < lVar7) {
      do {
        lVar11 = 1;
        iVar3 = 2;
        do {
          lVar11 = lVar11 * lVar7;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
        if (lVar11 - x / lVar7 == 0 || lVar11 < x / lVar7) goto LAB_0011f2bb;
        bVar19 = 1 < lVar7;
        lVar7 = lVar7 + -1;
      } while (bVar19);
      lVar7 = 0;
    }
LAB_0011f2bb:
    do {
      lVar11 = lVar7;
      lVar7 = lVar11 + 1;
      lVar12 = 1;
      iVar3 = 2;
      do {
        lVar12 = lVar12 * lVar7;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    } while (lVar12 - x / lVar7 == 0 || lVar12 < x / lVar7);
    piVar16 = (int128_t *)(long)(dVar20 * (double)lVar11);
    uVar15 = 6;
    if ((long)piVar16 < 0xd) {
      uVar15 = (ulong)*(int *)(PhiTiny::pi + (long)piVar16 * 4);
    }
    x_01[7] = in_stack_ffffffffffffff0f;
    x_01._0_7_ = in_stack_ffffffffffffff08;
    x_01._8_8_ = dVar20;
    P2(&local_58,(primesum *)x,(int128_t)x_01,0,(int)piVar16);
    generate_primes(&local_e8,(int64_t)piVar16);
    generate_lpf(&local_a8,(int64_t)piVar16);
    generate_moebius(&local_c0,(int64_t)piVar16);
    x_02[7] = in_stack_ffffffffffffff0f;
    x_02._0_7_ = in_stack_ffffffffffffff08;
    x_02._8_8_ = dVar20;
    S1(&local_78,(primesum *)x,(int128_t)x_02,0,(int64_t)piVar16,(int)uVar15);
    lVar7 = x / (long)piVar16;
    piVar17 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + 1;
    piVar2 = piVar17;
    uVar13 = (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar17 >> 2;
    while (piVar1 = piVar2, 0 < (long)uVar13) {
      uVar8 = uVar13 >> 1;
      uVar13 = ~uVar8 + uVar13;
      piVar2 = piVar1 + uVar8 + 1;
      if ((long)piVar16 < (long)piVar1[uVar8]) {
        piVar2 = piVar1;
        uVar13 = uVar8;
      }
    }
    std::vector<char,_std::allocator<char>_>::vector
              (&local_90,lVar7 + 1,&stack0xffffffffffffff0f,
               (allocator_type *)&stack0xffffffffffffff0e);
    uVar13 = (long)piVar1 - (long)piVar17 >> 2;
    if ((long)uVar15 < 1) {
      uVar8 = 1;
    }
    else {
      uVar4 = 1;
      do {
        iVar3 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        for (lVar11 = (long)iVar3; lVar11 <= lVar7; lVar11 = lVar11 + iVar3) {
          local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] = '\0';
        }
        uVar8 = uVar4 + 1;
        bVar19 = uVar4 != uVar15;
        uVar4 = uVar8;
      } while (bVar19);
    }
    lVar11 = 0;
    if ((long)uVar8 < (long)uVar13) {
      do {
        lVar12 = (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar8];
        if ((long)piVar16 / lVar12 < (long)piVar16) {
          lVar18 = 0;
          piVar10 = piVar16;
          lVar14 = 1;
          do {
            lVar6 = lVar14;
            if (((long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar10] != 0) &&
               (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] <
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar10])) {
              lVar5 = x / ((long)piVar10 * lVar12);
              if (lVar14 <= lVar5) {
                lVar6 = lVar5 + 1;
                do {
                  lVar18 = lVar18 + local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    .super__Vector_impl_data._M_start[lVar14] * lVar14;
                  lVar14 = lVar14 + 1;
                } while (lVar6 != lVar14);
              }
              lVar11 = lVar11 - (long)piVar10 * lVar12 *
                                (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start[(long)piVar10] * lVar18;
            }
            piVar10 = (int128_t *)((long)piVar10 + -1);
            lVar14 = lVar6;
          } while ((long)piVar16 / lVar12 < (long)piVar10);
        }
        if (lVar12 <= lVar7) {
          lVar14 = lVar12 * 2;
          do {
            local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start[lVar12] = '\0';
            lVar12 = lVar12 + lVar14;
          } while (lVar12 <= lVar7);
        }
        uVar8 = uVar8 + 1;
        local_d0 = uVar13;
        local_c8 = piVar16;
      } while (uVar8 != uVar13);
    }
    if (local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      uVar8 = (long)local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
              (long)local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      operator_delete(local_90.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar8);
    }
    piVar16 = prime_sum_tiny(piVar16,uVar8);
    if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar9 = (long)piVar16 + ~(ulong)local_58.low + (long)local_78.low + lVar11;
  }
  return iVar9;
}

Assistant:

int64_t pi_lmo2(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> primes = generate_primes(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> mu = generate_moebius(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}